

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uint64_t secp256k1_read_be64(uchar *p)

{
  uchar *p_local;
  
  return (ulong)*p << 0x38 | (ulong)p[1] << 0x30 | (ulong)p[2] << 0x28 | (ulong)p[3] << 0x20 |
         (ulong)p[4] << 0x18 | (ulong)p[5] << 0x10 | (ulong)p[6] << 8 | (ulong)p[7];
}

Assistant:

SECP256K1_INLINE static uint64_t secp256k1_read_be64(const unsigned char* p) {
    return (uint64_t)p[0] << 56 |
           (uint64_t)p[1] << 48 |
           (uint64_t)p[2] << 40 |
           (uint64_t)p[3] << 32 |
           (uint64_t)p[4] << 24 |
           (uint64_t)p[5] << 16 |
           (uint64_t)p[6] << 8  |
           (uint64_t)p[7];
}